

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc.h
# Opt level: O0

void * snmalloc::libc::memalign(size_t alignment,size_t size)

{
  bool bVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *pAVar2;
  size_t sVar3;
  smallsizeclass_t sVar4;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *this;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  BVar5;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *in_RSI;
  anon_class_1_0_00000001 *in_RDI;
  undefined8 *in_FS_OFFSET;
  size_t result;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  p;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  smallsizeclass_t sizeclass;
  FreeListKey *key;
  anon_class_8_1_8991fb9c domesticate;
  Alloc<void> r;
  size_t in_stack_fffffffffffffe28;
  size_t in_stack_fffffffffffffe30;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *sizeclass_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *key_00;
  anon_class_8_1_8991fb9c domesticate_00;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_stack_fffffffffffffe70;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe78;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *alloc;
  long local_130;
  
  if (in_RDI != (anon_class_1_0_00000001 *)0x0) {
    in_stack_fffffffffffffe78 = in_RDI;
  }
  if (in_RDI != (anon_class_1_0_00000001 *)0x0 && ((ulong)in_RDI & (ulong)(in_RDI + -1)) == 0) {
    sizeclass_00 = *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     **)*in_FS_OFFSET;
    local_130 = ((ulong)(in_RDI + -1) | (ulong)&in_RSI[-1].field_0x23ff) + 1;
    alloc = in_RSI;
    bVar1 = is_small_sizeclass(in_stack_fffffffffffffe30);
    if (((!bVar1) && (local_130 == 0)) &&
       (in_RSI != (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                   *)0x0)) {
      local_130 = -1;
    }
    pAVar2 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
             (local_130 + -1);
    domesticate_00.this = sizeclass_00;
    sVar3 = sizeclass_to_size((smallsizeclass_t)sizeclass_00);
    if ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
        (sVar3 - 1) < pAVar2) {
      BVar5.unsafe_capptr =
           (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
              alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>
                        ((size_t)domesticate_00.this,pAVar2);
    }
    else {
      key_00 = sizeclass_00;
      sVar4 = size_to_sizeclass(in_stack_fffffffffffffe28);
      this = (sizeclass_00->super_FastFreeLists).small_fast_free_lists + sVar4;
      bVar1 = freelist::
              Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
              ::empty(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        pAVar2 = sizeclass_00;
        Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
        message_queue((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                       *)0x1088f3);
        bVar1 = RemoteAllocator::can_dequeue((RemoteAllocator *)0x1088fb);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          BVar5.unsafe_capptr =
               (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                  ::
                  handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                            (pAVar2,sizeclass_00,sVar4,this);
        }
        else {
          BVar5.unsafe_capptr =
               (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                *)Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                  ::small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                  anon_class_1_0_00000001::operator()
                            (in_RDI,alloc,(smallsizeclass_t)in_stack_fffffffffffffe78,
                             in_stack_fffffffffffffe70);
        }
      }
      else {
        BVar5 = freelist::
                Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                ::
                take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                          ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                            *)pAVar2,(FreeListKey *)key_00,domesticate_00);
      }
    }
  }
  else {
    BVar5.unsafe_capptr =
         (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          *)set_error(0);
  }
  return BVar5.unsafe_capptr;
}

Assistant:

inline void* memalign(size_t alignment, size_t size)
  {
    if (SNMALLOC_UNLIKELY(alignment == 0 || !bits::is_pow2(alignment)))
    {
      return set_error(EINVAL);
    }

    return alloc_aligned(alignment, size);
  }